

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_mul_ppc(float64 a,float64 b,float_status *s)

{
  ulong a_00;
  ulong uVar1;
  float64 fVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  FloatParts FVar8;
  FloatParts FVar9;
  uint64_t hi;
  ulong local_40;
  uint64_t local_38;
  
  FVar8 = float64_unpack_raw(a);
  FVar8 = sf_canonicalize(FVar8,&float64_params,s);
  uVar6 = FVar8._8_8_;
  a_00 = FVar8.frac;
  FVar9 = float64_unpack_raw(b);
  FVar9 = sf_canonicalize(FVar9,&float64_params,s);
  uVar1 = FVar9._8_8_;
  uVar4 = (uVar1 ^ uVar6) & 0x10000000000;
  uVar3 = FVar8._12_4_ & 0xff;
  uVar5 = FVar9._12_4_ & 0xff;
  if ((uVar3 == 2) && (uVar5 == 2)) {
    mul64To128(a_00,FVar9.frac,&local_38,&local_40);
    uVar1 = local_38 << 2 | local_40 >> 0x3e;
    bVar7 = (local_40 & 0x3fffffffffffffff) != 0;
    a_00 = (ulong)((uint)bVar7 | (uint)uVar1 & 1) | uVar1 >> 1;
    if (-1 < (long)uVar1) {
      a_00 = bVar7 | uVar1;
    }
    uVar6 = uVar6 & 0xffff00ff00000000 |
            (ulong)(uint)((FVar9.exp + FVar8.exp) - (int)((long)(local_38 << 2) >> 0x3f));
  }
  else {
    if (((uVar6 | uVar1) & 0xfc00000000) != 0) {
      FVar8 = pick_nan(FVar8,FVar9,s);
      goto LAB_00922ae3;
    }
    if (((uVar3 == 3) && (uVar5 == 1)) || ((uVar3 == 1 && (uVar5 == 3)))) {
      s->float_exception_flags = s->float_exception_flags | 1;
      FVar8.exp = 0x7fffffff;
      FVar8.cls = float_class_qnan;
      FVar8.sign = false;
      FVar8._14_2_ = 0;
      FVar8.frac = 0x2000000000000000;
      goto LAB_00922ae3;
    }
    if ((uVar3 | 2) != 3) {
      if ((uVar5 | 2) != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar4 = uVar4 | uVar1 & 0xffff0003ffffffff;
      FVar8.exp = (int)uVar4;
      FVar8.cls = (char)(uVar4 >> 0x20);
      FVar8.sign = (_Bool)(char)(uVar4 >> 0x28);
      FVar8._14_2_ = (short)(uVar4 >> 0x30);
      FVar8.frac = FVar9.frac;
      goto LAB_00922ae3;
    }
    uVar6 = uVar6 & 0xffff0003ffffffff;
  }
  uVar6 = uVar6 | uVar4;
  FVar8.exp = (int)uVar6;
  FVar8.cls = (char)(uVar6 >> 0x20);
  FVar8.sign = (_Bool)(char)(uVar6 >> 0x28);
  FVar8._14_2_ = (short)(uVar6 >> 0x30);
  FVar8.frac = a_00;
LAB_00922ae3:
  FVar8 = round_canonical(FVar8,s,&float64_params);
  fVar2 = float64_pack_raw(FVar8);
  return fVar2;
}

Assistant:

float64 QEMU_FLATTEN
float64_mul(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_mul, soft_f64_mul,
                        f64_is_zon2, NULL, f64_mul_fast_test, f64_mul_fast_op);
}